

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Error skip_literal_string(FT_Byte **acur,FT_Byte *limit)

{
  byte bVar1;
  FT_Error FVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  
  pbVar5 = *acur;
  FVar2 = 3;
  if (pbVar5 < limit) {
    iVar3 = 0;
    pbVar4 = pbVar5;
    do {
      bVar1 = *pbVar4;
      pbVar5 = pbVar4 + 1;
      FVar2 = 3;
      if (bVar1 == 0x28) {
        iVar3 = iVar3 + 1;
      }
      else if (bVar1 == 0x29) {
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) {
          FVar2 = 0;
          break;
        }
      }
      else if (bVar1 == 0x5c) {
        if (pbVar5 == limit) break;
        uVar6 = *pbVar5 - 0x5c;
        if (((uVar6 < 0x19) && ((0x1440441U >> (uVar6 & 0x1f) & 1) != 0)) || (*pbVar5 - 0x28 < 2)) {
          pbVar5 = pbVar4 + 2;
        }
        else if (pbVar5 < limit) {
          uVar6 = 0;
          do {
            if (((*pbVar5 & 0xf8) != 0x30) || (pbVar5 = pbVar5 + 1, 1 < uVar6)) break;
            uVar6 = uVar6 + 1;
          } while (pbVar5 < limit);
        }
      }
      pbVar4 = pbVar5;
    } while (pbVar5 < limit);
  }
  *acur = pbVar5;
  return FVar2;
}

Assistant:

static FT_Error
  skip_literal_string( FT_Byte*  *acur,
                       FT_Byte*   limit )
  {
    FT_Byte*      cur   = *acur;
    FT_Int        embed = 0;
    FT_Error      error = FT_ERR( Invalid_File_Format );
    unsigned int  i;


    while ( cur < limit )
    {
      FT_Byte  c = *cur;


      cur++;

      if ( c == '\\' )
      {
        /* Red Book 3rd ed., section `Literal Text Strings', p. 29:     */
        /* A backslash can introduce three different types              */
        /* of escape sequences:                                         */
        /*   - a special escaped char like \r, \n, etc.                 */
        /*   - a one-, two-, or three-digit octal number                */
        /*   - none of the above in which case the backslash is ignored */

        if ( cur == limit )
          /* error (or to be ignored?) */
          break;

        switch ( *cur )
        {
          /* skip `special' escape */
        case 'n':
        case 'r':
        case 't':
        case 'b':
        case 'f':
        case '\\':
        case '(':
        case ')':
          cur++;
          break;

        default:
          /* skip octal escape or ignore backslash */
          for ( i = 0; i < 3 && cur < limit; i++ )
          {
            if ( !IS_OCTAL_DIGIT( *cur ) )
              break;

            cur++;
          }
        }
      }
      else if ( c == '(' )
        embed++;
      else if ( c == ')' )
      {
        embed--;
        if ( embed == 0 )
        {
          error = FT_Err_Ok;
          break;
        }
      }
    }

    *acur = cur;

    return error;
  }